

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeCursor(Btree *p,Pgno iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  BtCursor **ppBVar1;
  BtShared *pBt;
  BtCursor *pBVar2;
  byte bVar3;
  int iVar4;
  BtCursor **ppBVar5;
  
  pBt = p->pBt;
  if (iTable < 2) {
    if (iTable == 0) {
      iVar4 = sqlite3CorruptError(0x11bb4);
      return iVar4;
    }
    iTable = (Pgno)(pBt->nPage != 0);
  }
  pCur->pgnoRoot = iTable;
  pCur->iPage = -1;
  pCur->pKeyInfo = pKeyInfo;
  pCur->pBtree = p;
  pCur->pBt = pBt;
  pCur->curFlags = '\0';
  ppBVar1 = &pBt->pCursor;
  bVar3 = 0;
  ppBVar5 = ppBVar1;
  while( true ) {
    pBVar2 = *ppBVar5;
    if (pBVar2 == (BtCursor *)0x0) break;
    if (pBVar2->pgnoRoot == iTable) {
      pBVar2->curFlags = pBVar2->curFlags | 0x20;
      pCur->curFlags = ' ';
      bVar3 = 0x20;
    }
    ppBVar5 = &pBVar2->pNext;
  }
  pCur->eState = '\x01';
  pCur->pNext = *ppBVar1;
  *ppBVar1 = pCur;
  if (wrFlag == 0) {
    pCur->curPagerFlags = '\x02';
  }
  else {
    pCur->curFlags = bVar3 | 1;
    pCur->curPagerFlags = '\0';
    if (pBt->pTmpSpace == (u8 *)0x0) {
      iVar4 = allocateTempSpace(pBt);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

static int btreeCursor(
  Btree *p,                              /* The btree */
  Pgno iTable,                           /* Root page of table to open */
  int wrFlag,                            /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,              /* First arg to comparison function */
  BtCursor *pCur                         /* Space for new cursor */
){
  BtShared *pBt = p->pBt;                /* Shared b-tree handle */
  BtCursor *pX;                          /* Looping over other all cursors */

  assert( sqlite3BtreeHoldsMutex(p) );
  assert( wrFlag==0
       || wrFlag==BTREE_WRCSR
       || wrFlag==(BTREE_WRCSR|BTREE_FORDELETE)
  );

  /* The following assert statements verify that if this is a sharable
  ** b-tree database, the connection is holding the required table locks,
  ** and that no other connection has any open cursor that conflicts with
  ** this lock.  The iTable<1 term disables the check for corrupt schemas. */
  assert( hasSharedCacheTableLock(p, iTable, pKeyInfo!=0, (wrFlag?2:1))
          || iTable<1 );
  assert( wrFlag==0 || !hasReadConflicts(p, iTable) );

  /* Assert that the caller has opened the required transaction. */
  assert( p->inTrans>TRANS_NONE );
  assert( wrFlag==0 || p->inTrans==TRANS_WRITE );
  assert( pBt->pPage1 && pBt->pPage1->aData );
  assert( wrFlag==0 || (pBt->btsFlags & BTS_READ_ONLY)==0 );

  if( iTable<=1 ){
    if( iTable<1 ){
      return SQLITE_CORRUPT_BKPT;
    }else if( btreePagecount(pBt)==0 ){
      assert( wrFlag==0 );
      iTable = 0;
    }
  }

  /* Now that no other errors can occur, finish filling in the BtCursor
  ** variables and link the cursor into the BtShared list.  */
  pCur->pgnoRoot = iTable;
  pCur->iPage = -1;
  pCur->pKeyInfo = pKeyInfo;
  pCur->pBtree = p;
  pCur->pBt = pBt;
  pCur->curFlags = 0;
  /* If there are two or more cursors on the same btree, then all such
  ** cursors *must* have the BTCF_Multiple flag set. */
  for(pX=pBt->pCursor; pX; pX=pX->pNext){
    if( pX->pgnoRoot==iTable ){
      pX->curFlags |= BTCF_Multiple;
      pCur->curFlags = BTCF_Multiple;
    }
  }
  pCur->eState = CURSOR_INVALID;
  pCur->pNext = pBt->pCursor;
  pBt->pCursor = pCur;
  if( wrFlag ){
    pCur->curFlags |= BTCF_WriteFlag;
    pCur->curPagerFlags = 0;
    if( pBt->pTmpSpace==0 ) return allocateTempSpace(pBt);
  }else{
    pCur->curPagerFlags = PAGER_GET_READONLY;
  }
  return SQLITE_OK;
}